

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateCharacterState.cpp
# Opt level: O0

void __thiscall
CreateCharacterState::processInput
          (CreateCharacterState *this,string *input,shared_ptr<Connection> *connection)

{
  element_type *peVar1;
  mapped_type *pmVar2;
  shared_ptr<Connection> local_100;
  shared_ptr<Connection> local_f0;
  shared_ptr<Connection> local_e0;
  shared_ptr<Connection> local_d0;
  shared_ptr<Connection> local_c0;
  shared_ptr<Connection> local_b0;
  int local_9c;
  mapped_type local_98;
  int state;
  undefined1 local_88 [8];
  Account account;
  string username;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  CreateCharacterState *this_local;
  
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  Connection::GetUsername_abi_cxx11_
            ((Connection *)
             &account.m_characters.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  peVar1 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  Connection::GetAccount((Account *)local_88,peVar1);
  peVar1 = std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      connection);
  local_9c = Connection::GetID(peVar1);
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](&this->m_state_map,&local_9c);
  local_98 = *pmVar2;
  switch(local_98) {
  case 0:
    std::shared_ptr<Connection>::shared_ptr(&local_b0,connection);
    processSelectCharacter(this,input,&local_b0);
    std::shared_ptr<Connection>::~shared_ptr(&local_b0);
    break;
  case 1:
    std::shared_ptr<Connection>::shared_ptr(&local_c0,connection);
    processChooseRace(this,input,&local_c0);
    std::shared_ptr<Connection>::~shared_ptr(&local_c0);
    break;
  case 2:
    std::shared_ptr<Connection>::shared_ptr(&local_d0,connection);
    processChooseClass(this,input,&local_d0);
    std::shared_ptr<Connection>::~shared_ptr(&local_d0);
    break;
  case 3:
    std::shared_ptr<Connection>::shared_ptr(&local_e0,connection);
    processRollStats(this,input,&local_e0);
    std::shared_ptr<Connection>::~shared_ptr(&local_e0);
    break;
  case 4:
    std::shared_ptr<Connection>::shared_ptr(&local_f0,connection);
    processNameCharacter(this,input,&local_f0);
    std::shared_ptr<Connection>::~shared_ptr(&local_f0);
    break;
  case 5:
    std::shared_ptr<Connection>::shared_ptr(&local_100,connection);
    processConfirmCharacter(this,input,&local_100);
    std::shared_ptr<Connection>::~shared_ptr(&local_100);
  }
  Account::~Account((Account *)local_88);
  std::__cxx11::string::~string
            ((string *)
             &account.m_characters.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CreateCharacterState::processInput(const std::string& input, std::shared_ptr<Connection> connection) {
    std::string username = connection->GetUsername();
    Account account = connection->GetAccount();
    int state = m_state_map[connection->GetID()];
    switch(state)
    {
        case SELECT_CHARACTER:
            processSelectCharacter(input, connection);
            break;
        case CHOOSE_RACE:
            processChooseRace(input, connection);
            break;
        case CHOOSE_CLASS:
            processChooseClass(input, connection);
            break;
        case ROLL_STATS:
            processRollStats(input, connection);
            break;
        case NAME_CHARACTER:
            processNameCharacter(input, connection);
            break;
        case CONFIRM_CHARACTER:
            processConfirmCharacter(input, connection);
            break;
        default:
            break;
    }
}